

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O0

bool myutils::parse_addr(char *addr,string *ip,int *port)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  allocator local_59;
  string local_58 [32];
  char *local_38;
  char *p2;
  char *p;
  int *port_local;
  string *ip_local;
  char *addr_local;
  
  p = (char *)port;
  port_local = (int *)ip;
  ip_local = (string *)addr;
  iVar2 = memcmp(addr,"tcp://",6);
  if (iVar2 == 0) {
    p2 = (char *)(ip_local + 6);
    local_38 = strrchr(p2,0x3a);
    pcVar1 = p2;
    if (local_38 == (char *)0x0) {
      addr_local._7_1_ = false;
    }
    else {
      uVar3 = (long)local_38 - (long)p2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,pcVar1,uVar3,&local_59);
      std::__cxx11::string::operator=((string *)port_local,local_58);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      iVar2 = atoi(local_38 + 1);
      *(int *)p = iVar2;
      addr_local._7_1_ = true;
    }
  }
  else {
    addr_local._7_1_ = false;
  }
  return addr_local._7_1_;
}

Assistant:

bool parse_addr(const char* addr, string* ip, int* port)
    {
        if (memcmp(addr, "tcp://", 6) != 0) return false;
        const char* p = addr + 6;
        const char* p2 = strrchr(p, ':');
        if (p2) {
            *ip = string(p, p2 - p);
            *port = atoi(p2 + 1);
            return true;
        }
        else {
            return false;
        }
    }